

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# standard_buffer_manager.cpp
# Opt level: O3

string * __thiscall
duckdb::StandardBufferManager::GetTemporaryPath_abi_cxx11_
          (string *__return_storage_ptr__,StandardBufferManager *this,block_id_t id)

{
  bool bVar1;
  uint uVar2;
  FileSystem *this_00;
  long *plVar3;
  ulong uVar4;
  long *plVar5;
  size_type *psVar6;
  uint __len;
  ulong __val;
  string __str;
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  string local_50;
  
  this_00 = FileSystem::GetFileSystem(this->db);
  __val = -id;
  if (0 < id) {
    __val = id;
  }
  __len = 1;
  if (9 < __val) {
    uVar4 = __val;
    uVar2 = 4;
    do {
      __len = uVar2;
      if (uVar4 < 100) {
        __len = __len - 2;
        goto LAB_017c7f9e;
      }
      if (uVar4 < 1000) {
        __len = __len - 1;
        goto LAB_017c7f9e;
      }
      if (uVar4 < 10000) goto LAB_017c7f9e;
      bVar1 = 99999 < uVar4;
      uVar4 = uVar4 / 10000;
      uVar2 = __len + 4;
    } while (bVar1);
    __len = __len + 1;
  }
LAB_017c7f9e:
  local_90[0] = local_80;
  ::std::__cxx11::string::_M_construct((ulong)local_90,(char)__len - (char)(id >> 0x3f));
  ::std::__detail::__to_chars_10_impl<unsigned_long>(local_90[0] + -(id >> 0x3f),__len,__val);
  plVar3 = (long *)::std::__cxx11::string::replace((ulong)local_90,0,(char *)0x0,0x1e13412);
  plVar5 = plVar3 + 2;
  if ((long *)*plVar3 == plVar5) {
    local_60 = *plVar5;
    lStack_58 = plVar3[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar5;
    local_70 = (long *)*plVar3;
  }
  local_68 = plVar3[1];
  *plVar3 = (long)plVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)::std::__cxx11::string::append((char *)&local_70);
  psVar6 = (size_type *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar6) {
    local_50.field_2._M_allocated_capacity = *psVar6;
    local_50.field_2._8_8_ = plVar3[3];
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  }
  else {
    local_50.field_2._M_allocated_capacity = *psVar6;
    local_50._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_50._M_string_length = plVar3[1];
  *plVar3 = (long)psVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  FileSystem::JoinPath
            ((string *)__return_storage_ptr__,this_00,(string *)&this->temporary_directory,&local_50
            );
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70);
  }
  if (local_90[0] != local_80) {
    operator_delete(local_90[0]);
  }
  return __return_storage_ptr__;
}

Assistant:

string StandardBufferManager::GetTemporaryPath(block_id_t id) {
	auto &fs = FileSystem::GetFileSystem(db);
	return fs.JoinPath(temporary_directory.path, "duckdb_temp_block-" + to_string(id) + ".block");
}